

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O3

void text_out_to_file(uint8_t a,char *str)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  wchar_t wVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  byte *buf_00;
  wchar_t i;
  wchar_t wVar9;
  uint uVar10;
  size_t n;
  char buf [1024];
  byte local_438 [1032];
  
  buf_00 = local_438;
  wVar4 = L'K';
  if (text_out_wrap != L'\0') {
    wVar4 = text_out_wrap;
  }
  my_strcpy((char *)local_438,str,0x400);
  do {
    if (local_438[0] == 0) {
      return;
    }
    uVar6 = wVar4 - text_out_to_file::pos;
    uVar10 = 0;
    if (0 < (int)uVar6) {
      uVar10 = uVar6;
    }
    if (L'\0' < text_out_indent && text_out_to_file::pos == L'\0') {
      wVar9 = L'\0';
      do {
        file_writec(text_out_file,' ');
        text_out_to_file::pos = text_out_to_file::pos + L'\x01';
        wVar9 = wVar9 + L'\x01';
      } while (wVar9 < text_out_indent);
    }
    if ((int)uVar6 < 1) {
      uVar2 = 0xffffffff;
      uVar7 = 0;
    }
    else {
      uVar3 = 0xffffffff;
      uVar5 = 0;
      do {
        uVar2 = (uint)uVar3;
        bVar1 = buf_00[uVar5];
        uVar7 = (uint)uVar5;
        if ((bVar1 == 0) || (bVar1 == 10)) break;
        if (bVar1 == 0x20) {
          uVar3 = uVar5 & 0xffffffff;
        }
        uVar2 = (uint)uVar3;
        uVar5 = uVar5 + 1;
        uVar7 = uVar6;
      } while (uVar6 != uVar5);
    }
    if ((uVar2 == 0xffffffff) && (uVar7 == uVar10)) {
      uVar7 = uVar10;
      if ((text_out_to_file::pos == text_out_indent) ||
         (((ulong)*buf_00 < 0x2f &&
          (uVar7 = 1, (0x500100000000U >> ((ulong)*buf_00 & 0x3f) & 1) != 0)))) goto LAB_00214b59;
      file_writec(text_out_file,'\n');
      local_438[0] = *buf_00;
    }
    else {
      if ((buf_00[uVar7] != 0) && (buf_00[uVar7] != 10)) {
        uVar7 = uVar2;
      }
LAB_00214b59:
      n = (size_t)(int)uVar7;
      file_write(text_out_file,(char *)buf_00,n);
      text_out_to_file::pos = text_out_to_file::pos + uVar7;
      pbVar8 = buf_00 + n;
      if (buf_00[n] == 10) {
        pbVar8 = pbVar8 + 1;
      }
      else if (buf_00[n] == 0) {
        return;
      }
      file_writec(text_out_file,'\n');
      buf_00 = pbVar8 + -1;
      do {
        local_438[0] = buf_00[1];
        buf_00 = buf_00 + 1;
      } while (local_438[0] == 0x20);
    }
    text_out_to_file::pos = L'\0';
  } while( true );
}

Assistant:

void text_out_to_file(uint8_t a, const char *str)
{
	const char *s;
	char buf[1024];

	/* Current position on the line */
	static int pos = 0;

	/* Wrap width */
	int wrap = (text_out_wrap ? text_out_wrap : 75);

	/* Unused parameter */
	(void)a;

	/* Copy to a rewriteable string */
 	my_strcpy(buf, str, 1024);

	/* Current location within "buf" */
 	s = buf;

	/* Process the string */
	while (*s) {
		int n = 0;
		int len = wrap - pos;
		int l_space = -1;

		/* In case we are already past the wrap point (which can happen with
		 * punctuation at the end of the line), make sure we don't overrun.
		 */
		if (len < 0)
			len = 0;

		/* If we are at the start of the line... */
		if (pos == 0) {
			int i;

			/* Output the indent */
			for (i = 0; i < text_out_indent; i++) {
				file_writec(text_out_file, ' ');
				pos++;
			}
		}

		/* Find length of line up to next newline or end-of-string */
		while ((n < len) && !((s[n] == '\n') || (s[n] == '\0'))) {
			/* Mark the most recent space in the string */
			if (s[n] == ' ') l_space = n;

			/* Increment */
			n++;
		}

		/* If we have encountered no spaces */
		if ((l_space == -1) && (n == len)) {
			/* If we are at the start of a new line */
			if (pos == text_out_indent) {
				len = n;
			} else if ((s[0] == ' ') || (s[0] == ',') || (s[0] == '.')) {
				/* HACK - Output punctuation at the end of the line */
				len = 1;
			} else {
				/* Begin a new line */
				file_writec(text_out_file, '\n');

				/* Reset */
				pos = 0;

				continue;
			}
		} else {
			/* Wrap at the newline */
			if ((s[n] == '\n') || (s[n] == '\0')) len = n;

			/* Wrap at the last space */
			else len = l_space;
		}

		/* Write that line to file */
		file_write(text_out_file, s, len);
		pos += len;

		/* Move 's' past the stuff we've written */
		s += len;

		/* If we are at the end of the string, end */
		if (*s == '\0') return;

		/* Skip newlines */
		if (*s == '\n') s++;

		/* Begin a new line */
		file_writec(text_out_file, '\n');

		/* Reset */
		pos = 0;

		/* Skip whitespace */
		while (*s == ' ') s++;
	}

	/* We are done */
	return;
}